

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::registerTestCase
               (ITestCase *testCase,char *classOrQualifiedMethodName,NameAndDesc *nameAndDesc,
               SourceLineInfo *lineInfo)

{
  char *pcVar1;
  IMutableRegistryHub *pIVar2;
  undefined8 *in_RDX;
  char *in_RSI;
  SourceLineInfo *in_stack_000000a8;
  string *in_stack_000000b0;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  ITestCase *in_stack_000000c8;
  TestCase *this;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [40];
  string *in_stack_fffffffffffffe78;
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  undefined1 local_138 [288];
  undefined8 *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pIVar2 = getMutableRegistryHub();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,local_10,&local_179);
  extractClassName(in_stack_fffffffffffffe78);
  pcVar1 = (char *)*local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,pcVar1,&local_1b1);
  this = (TestCase *)local_18[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,(char *)this,&local_1d9);
  makeTestCase(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
               in_stack_000000a8);
  (*pIVar2->_vptr_IMutableRegistryHub[4])(pIVar2,local_138);
  TestCase::~TestCase(this);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  return;
}

Assistant:

void registerTestCase
        (   ITestCase* testCase,
            char const* classOrQualifiedMethodName,
            NameAndDesc const& nameAndDesc,
            SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase
                (   testCase,
                    extractClassName( classOrQualifiedMethodName ),
                    nameAndDesc.name,
                    nameAndDesc.description,
                    lineInfo ) );
    }